

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void ts_parser__breakdown_lookahead
               (TSParser *self,Subtree *lookahead,TSStateId state,ReusableNode *reusable_node)

{
  ushort uVar1;
  uint32_t uVar2;
  bool bVar3;
  char *pcVar4;
  Subtree self_00;
  
  uVar2 = (reusable_node->stack).size;
  if (uVar2 == 0) {
    self_00.ptr = (SubtreeHeapData *)0x0;
  }
  else {
    self_00 = (Subtree)(reusable_node->stack).contents[uVar2 - 1].tree.ptr;
  }
  bVar3 = false;
  while (((((ulong)self_00.ptr & 1) == 0 && ((self_00.ptr)->child_count != 0)) &&
         ((self_00.ptr)->parse_state != state))) {
    if (((self->lexer).logger.log != (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
       (self->dot_graph_file != (FILE *)0x0)) {
      uVar1 = (self_00.ptr)->symbol;
      pcVar4 = "ERROR";
      if (uVar1 != 0xffff) {
        if (uVar1 == 0xfffe) {
          pcVar4 = "_ERROR";
        }
        else {
          pcVar4 = self->language->symbol_names[uVar1];
        }
      }
      snprintf((self->lexer).debug_buffer,0x400,"state_mismatch sym:%s",pcVar4);
      ts_parser__log(self);
    }
    reusable_node_descend(reusable_node);
    uVar2 = (reusable_node->stack).size;
    bVar3 = true;
    self_00.ptr = (SubtreeHeapData *)0x0;
    if (uVar2 != 0) {
      self_00 = (Subtree)(reusable_node->stack).contents[uVar2 - 1].tree.ptr;
    }
  }
  if (bVar3) {
    ts_subtree_release(&self->tree_pool,*lookahead);
    lookahead->ptr = (SubtreeHeapData *)self_00;
    ts_subtree_retain(self_00);
    return;
  }
  return;
}

Assistant:

static void ts_parser__breakdown_lookahead(TSParser *self, Subtree *lookahead,
                                           TSStateId state, ReusableNode *reusable_node) {
  bool did_descend = false;
  Subtree tree = reusable_node_tree(reusable_node);
  while (ts_subtree_child_count(tree) > 0 && ts_subtree_parse_state(tree) != state) {
    LOG("state_mismatch sym:%s", TREE_NAME(tree));
    reusable_node_descend(reusable_node);
    tree = reusable_node_tree(reusable_node);
    did_descend = true;
  }

  if (did_descend) {
    ts_subtree_release(&self->tree_pool, *lookahead);
    *lookahead = tree;
    ts_subtree_retain(*lookahead);
  }
}